

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

Gia_Man_t *
Gia_ManBmcUnroll(Gia_Man_t *pGia,int nFramesMax,int nFramesAdd,int fVerbose,Vec_Int_t **pvPiMap)

{
  void **__s;
  char *__s_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint nCap;
  int iVar4;
  Vec_Int_t *vNodes;
  Vec_Int_t *vLeaves;
  Vec_Ptr_t *p;
  Vec_Int_t *pVVar5;
  Vec_Ptr_t *p_00;
  long lVar6;
  void *pvVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *p_01;
  size_t sVar9;
  char *__dest;
  Vec_Int_t *vCos;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar10;
  int i;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint i_00;
  int iVar14;
  uint *local_90;
  uint *local_68;
  int iFirst;
  
  Gia_ManCleanPhase(pGia);
  vNodes = Vec_IntAlloc(1000);
  vLeaves = Vec_IntAlloc(1000);
  p = Bmc_MnaTernary(pGia,nFramesMax,nFramesAdd,fVerbose,&iFirst);
  pVVar5 = Vec_IntAlloc(1000);
  *pvPiMap = pVVar5;
  nCap = p->nSize;
  p_00 = Vec_PtrAlloc(nCap);
  p_00->nSize = nCap;
  __s = p_00->pArray;
  lVar6 = (long)(int)nCap;
  memset(__s,0,lVar6 * 8);
  uVar1 = nCap;
  do {
    if ((int)uVar1 < 1) {
      __assert_fail("f >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                    ,0x143,"Gia_Man_t *Gia_ManBmcUnroll(Gia_Man_t *, int, int, int, Vec_Int_t **)");
    }
    i_00 = uVar1 - 1;
    pvVar7 = Vec_PtrEntry(p,i_00);
    if (i_00 == 0) {
      local_90 = (uint *)0x0;
    }
    else {
      local_90 = (uint *)Vec_PtrEntry(p,uVar1 - 2);
    }
    pVVar5 = Vec_IntAlloc(100);
    iVar14 = 0;
    while ((iVar14 < pGia->vCos->nSize - pGia->nRegs &&
           (pGVar8 = Gia_ManCo(pGia,iVar14), pGVar8 != (Gia_Obj_t *)0x0))) {
      uVar1 = Gia_ObjCioId(pGVar8);
      if ((~(*(uint *)((long)pvVar7 + (ulong)(uVar1 >> 4) * 4) >> ((char)uVar1 * '\x02' & 0x1fU)) &
          3) == 0) {
        iVar2 = Gia_ObjId(pGia,pGVar8);
        Vec_IntPush(pVVar5,iVar2);
      }
      iVar14 = iVar14 + 1;
    }
    iVar14 = vLeaves->nSize;
    iVar2 = 0;
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    for (; iVar14 != iVar2; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(vLeaves,iVar2);
      Vec_IntPush(pVVar5,iVar3);
    }
    __s[i_00] = pVVar5;
    Bmc_MnaCollect(pGia,pVVar5,vNodes,local_90);
    Bmc_MnaSelect(pGia,pVVar5,vNodes,vLeaves);
    if (fVerbose == 0) {
      uVar11 = vLeaves->nSize;
    }
    else {
      uVar11 = vLeaves->nSize;
      printf("Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n",(ulong)i_00,
             (ulong)(uint)pVVar5->nSize,(ulong)uVar11,(ulong)(uint)vNodes->nSize);
    }
    uVar1 = i_00;
  } while (uVar11 != 0);
  pVVar5 = Vec_IntStartFull(pGia->nObjs);
  p_01 = Gia_ManStart(10000);
  __s_00 = pGia->pName;
  if (__s_00 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar9 = strlen(__s_00);
    __dest = (char *)malloc(sVar9 + 1);
    strcpy(__dest,__s_00);
  }
  p_01->pName = __dest;
  Gia_ManHashStart(p_01);
  if ((int)nCap < 1) {
    nCap = 0;
  }
  uVar12 = 0;
  do {
    uVar1 = (uint)uVar12;
    if (uVar1 == nCap) {
      Gia_ManHashStop(p_01);
      lVar13 = 0;
      if (lVar6 < 1) {
        lVar6 = lVar13;
      }
      for (; lVar6 != lVar13; lVar13 = lVar13 + 1) {
        if ((Vec_Ptr_t *)__s[lVar13] != (Vec_Ptr_t *)0x0) {
          Vec_PtrFree((Vec_Ptr_t *)__s[lVar13]);
        }
      }
      Vec_PtrFree(p_00);
      if (p != (Vec_Ptr_t *)0x0) {
        for (uVar1 = 0; nCap != uVar1; uVar1 = uVar1 + 1) {
          pvVar7 = Vec_PtrEntry(p,uVar1);
          if ((void *)0x2 < pvVar7) {
            free(pvVar7);
          }
        }
        Vec_PtrFree(p);
      }
      Vec_IntFree(vLeaves);
      Vec_IntFree(vNodes);
      Vec_IntFree(pVVar5);
      pGVar10 = Gia_ManCleanup(p_01);
      Gia_ManStop(p_01);
      return pGVar10;
    }
    vCos = (Vec_Int_t *)Vec_PtrEntry(p_00,uVar1);
    if (vCos == (Vec_Int_t *)0x0) {
      iVar14 = 0;
      while ((iVar14 < pGia->vCos->nSize - pGia->nRegs &&
             (pGVar8 = Gia_ManCo(pGia,iVar14), pGVar8 != (Gia_Obj_t *)0x0))) {
        Gia_ManAppendCo(p_01,0);
        iVar14 = iVar14 + 1;
      }
    }
    else {
      Vec_PtrEntry(p,uVar1);
      if (uVar1 == 0) {
        local_68 = (uint *)0x0;
      }
      else {
        local_68 = (uint *)Vec_PtrEntry(p,uVar1 - 1);
      }
      iVar14 = 0;
      while ((iVar14 < pGia->vCos->nSize - pGia->nRegs &&
             (pGVar8 = Gia_ManCo(pGia,iVar14), pGVar8 != (Gia_Obj_t *)0x0))) {
        iVar2 = Gia_ObjId(pGia,pGVar8);
        Vec_IntWriteEntry(pVVar5,iVar2,0);
        iVar14 = iVar14 + 1;
      }
      Vec_IntPush(*pvPiMap,~uVar1);
      Bmc_MnaCollect(pGia,vCos,vNodes,local_68);
      Bmc_MnaBuild(pGia,vCos,vNodes,p_01,pVVar5,*pvPiMap);
      if (fVerbose != 0) {
        printf("Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n",uVar12,
               (ulong)(uint)vCos->nSize,0,(ulong)(uint)vNodes->nSize);
      }
      iVar14 = 0;
      while ((iVar14 < pGia->vCos->nSize - pGia->nRegs &&
             (pGVar8 = Gia_ManCo(pGia,iVar14), pGVar8 != (Gia_Obj_t *)0x0))) {
        iVar2 = Gia_ObjId(pGia,pGVar8);
        iVar2 = Vec_IntEntry(pVVar5,iVar2);
        Gia_ManAppendCo(p_01,iVar2);
        iVar14 = iVar14 + 1;
      }
      for (iVar14 = 0; iVar14 < vCos->nSize; iVar14 = iVar14 + 1) {
        iVar2 = Vec_IntEntry(vCos,iVar14);
        pGVar8 = Gia_ManObj(pGia,iVar2);
        if (pGVar8 == (Gia_Obj_t *)0x0) break;
        iVar2 = Gia_ObjIsRi(pGia,pGVar8);
        if (iVar2 != 0) {
          iVar2 = Gia_ObjIsRi(pGia,pGVar8);
          if (iVar2 == 0) {
            __assert_fail("Gia_ObjIsRi(p, pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1dc,"Gia_Obj_t *Gia_ObjRiToRo(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar2 = pGia->vCis->nSize;
          iVar3 = pGia->vCos->nSize;
          iVar4 = Gia_ObjCioId(pGVar8);
          pObj = Gia_ManCi(pGia,(iVar2 - iVar3) + iVar4);
          iVar2 = Gia_ObjId(pGia,pObj);
          iVar3 = Gia_ObjId(pGia,pGVar8);
          iVar3 = Vec_IntEntry(pVVar5,iVar3);
          Vec_IntWriteEntry(pVVar5,iVar2,iVar3);
        }
      }
    }
    uVar12 = (ulong)(uVar1 + 1);
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManBmcUnroll( Gia_Man_t * pGia, int nFramesMax, int nFramesAdd, int fVerbose, Vec_Int_t ** pvPiMap )
{
    Gia_Obj_t * pObj;
    Gia_Man_t * pNew, * pTemp;
    Vec_Ptr_t * vStates, * vBegins;
    Vec_Int_t * vRoots, * vCone, * vLeaves, * vMap;
    unsigned * pStateF, * pStateP;
    int f, i, iFirst;
    Gia_ManCleanPhase( pGia );
    vCone = Vec_IntAlloc( 1000 );
    vLeaves = Vec_IntAlloc( 1000 );
    // perform ternary simulation
    vStates = Bmc_MnaTernary( pGia, nFramesMax, nFramesAdd, fVerbose, &iFirst );
    // go backward
    *pvPiMap = Vec_IntAlloc( 1000 );
    vBegins = Vec_PtrStart( Vec_PtrSize(vStates) );
    for ( f = Vec_PtrSize(vStates) - 1; f >= 0; f-- )
    {
        // get ternary states
        pStateF = (unsigned *)Vec_PtrEntry(vStates, f);
        pStateP = f ? (unsigned *)Vec_PtrEntry(vStates, f-1) : 0;
        // collect roots of this frame
        vRoots = Vec_IntAlloc( 100 );
        Gia_ManForEachPo( pGia, pObj, i )
            if ( Gia_ManTerSimInfoGet( pStateF, Gia_ObjCioId(pObj) ) == GIA_UND )
                Vec_IntPush( vRoots, Gia_ObjId(pGia, pObj) );
        // add leaves from the previous frame
        Vec_IntAppend( vRoots, vLeaves );
        Vec_PtrWriteEntry( vBegins, f, vRoots );
        // find the cone
        Bmc_MnaCollect( pGia, vRoots, vCone, pStateP ); // computes vCone
        Bmc_MnaSelect( pGia, vRoots, vCone, vLeaves );  // computes vLeaves 
        if ( fVerbose )
        printf( "Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n", 
            f, Vec_IntSize(vRoots), Vec_IntSize(vLeaves), Vec_IntSize(vCone) );
        if ( Vec_IntSize(vLeaves) == 0 )
            break;
        // it is possible that some of the POs are still ternary... 
    }
    assert( f >= 0 );
    // go forward
    vMap = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    Gia_ManHashStart( pNew );
    for ( f = 0; f < Vec_PtrSize(vStates); f++ )
    {
        vRoots = (Vec_Int_t *)Vec_PtrEntry( vBegins, f );
        if ( vRoots == NULL )
        {
            Gia_ManForEachPo( pGia, pObj, i )
                Gia_ManAppendCo( pNew, 0 );
            continue;
        }
        // get ternary states
        pStateF = (unsigned *)Vec_PtrEntry(vStates, f);
        pStateP = f ? (unsigned *)Vec_PtrEntry(vStates, f-1) : 0;
        // clean POs
        Gia_ManForEachPo( pGia, pObj, i )
            Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, pObj), 0 );
        // find the cone
        Vec_IntPush( *pvPiMap, -f-1 );
        Bmc_MnaCollect( pGia, vRoots, vCone, pStateP );   // computes vCone
        Bmc_MnaBuild( pGia, vRoots, vCone, pNew, vMap, *pvPiMap );  // computes pNew       
        if ( fVerbose )
        printf( "Frame %4d :  Roots = %6d  Leaves = %6d  Cone = %6d\n", 
            f, Vec_IntSize(vRoots), Vec_IntSize(vLeaves), Vec_IntSize(vCone) );
        // create POs
        Gia_ManForEachPo( pGia, pObj, i )
            Gia_ManAppendCo( pNew, Vec_IntEntry(vMap, Gia_ObjId(pGia, pObj)) );
        // set a new map
        Gia_ManForEachObjVec( vRoots, pGia, pObj, i )
            if ( Gia_ObjIsRi(pGia, pObj) )
                Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, Gia_ObjRiToRo(pGia, pObj)), Vec_IntEntry(vMap, Gia_ObjId(pGia, pObj)) );
//            else if ( Gia_ObjIsPo(pGia, pObj) )
//                Gia_ManAppendCo( pNew, Vec_IntEntry(vMap, Gia_ObjId(pGia, pObj)) );
//            else assert( 0 );
    }
    Gia_ManHashStop( pNew );
    Vec_VecFree( (Vec_Vec_t *)vBegins );
    Vec_PtrFreeFree( vStates );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCone );
    Vec_IntFree( vMap );
    // cleanup
//    Gia_ManPrintStats( pNew, NULL );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//    Gia_ManPrintStats( pNew, NULL );
    return pNew;
}